

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_args.cpp
# Opt level: O2

Result<void> *
ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *argsman,
                   CChainParams *chainparams,MemPoolOptions *mempool_opts)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  char *strDefault;
  bilingual_str *pbVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  optional<long> oVar5;
  string in_stack_fffffffffffffdf8;
  bilingual_str local_1d8;
  bilingual_str local_198;
  bilingual_str local_158;
  bilingual_str local_118;
  string local_d8;
  bilingual_str local_b8;
  string local_78;
  string local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  strDefault = (char *)mempool_opts;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"-checkmempool",(allocator<char> *)&local_58);
  iVar3 = ArgsManager::GetIntArg(argsman,&local_1d8.original,(long)mempool_opts->check_ratio);
  mempool_opts->check_ratio = (int)iVar3;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"-maxmempool",(allocator<char> *)&local_58);
  oVar5 = ArgsManager::GetIntArg(argsman,&local_1d8.original);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    mempool_opts->max_size_bytes =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload * 1000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"-mempoolexpiry",(allocator<char> *)&local_58);
  oVar5 = ArgsManager::GetIntArg(argsman,&local_1d8.original);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (mempool_opts->expiry).__r =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload * 0xe10;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"-incrementalrelayfee",(allocator<char> *)&local_58);
  bVar2 = ArgsManager::IsArgSet(argsman,&local_1d8.original);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"-incrementalrelayfee",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&stack0xfffffffffffffe07);
    strDefault = (char *)&local_78;
    ArgsManager::GetArg(&local_1d8.original,argsman,&local_58,(string *)strDefault);
    oVar5 = ParseMoney(&local_1d8.original);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    if (((undefined1  [16])
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (mempool_opts->incremental_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      goto LAB_00235ce2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"incrementalrelayfee",
               (allocator<char> *)&stack0xfffffffffffffe07);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-incrementalrelayfee",
               (allocator<char> *)&stack0xfffffffffffffe06);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)&stack0xfffffffffffffe05);
    ArgsManager::GetArg(&local_58,argsman,&local_78,&local_d8);
    common::AmountErrMsg(&local_b8,&local_1d8.original,&local_58);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_b8);
    pbVar4 = &local_b8;
LAB_00236383:
    bilingual_str::~bilingual_str(pbVar4);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    pbVar4 = &local_1d8;
  }
  else {
LAB_00235ce2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"-minrelaytxfee",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::IsArgSet(argsman,&local_1d8.original);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"-minrelaytxfee",(allocator<char> *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"",(allocator<char> *)&stack0xfffffffffffffe07);
      strDefault = (char *)&local_78;
      ArgsManager::GetArg(&local_1d8.original,argsman,&local_58,(string *)strDefault);
      oVar5 = ParseMoney(&local_1d8.original);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"minrelaytxfee",(allocator<char> *)&stack0xfffffffffffffe07)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"-minrelaytxfee",(allocator<char> *)&stack0xfffffffffffffe06)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"",(allocator<char> *)&stack0xfffffffffffffe05);
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_d8);
        common::AmountErrMsg(&local_118,&local_1d8.original,&local_58);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_118);
        pbVar4 = &local_118;
        goto LAB_00236383;
      }
      (mempool_opts->min_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    else {
      lVar1 = (mempool_opts->incremental_relay_feerate).nSatoshisPerK;
      if ((mempool_opts->min_relay_feerate).nSatoshisPerK < lVar1) {
        (mempool_opts->min_relay_feerate).nSatoshisPerK = lVar1;
        local_58._M_dataplus._M_p._0_4_ = 3;
        CFeeRate::ToString_abi_cxx11_
                  (&local_1d8.original,&mempool_opts->min_relay_feerate,(FeeEstimateMode *)&local_58
                  );
        logging_function._M_str = "ApplyArgsManOptions";
        logging_function._M_len = 0x13;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_args.cpp"
        ;
        source_file._M_len = 0x65;
        strDefault = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_args.cpp"
        ;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x45,ALL,Info,(ConstevalFormatString<1U>)0x6a6fd4,
                   &local_1d8.original);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"-dustrelayfee",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::IsArgSet(argsman,&local_1d8.original);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"-dustrelayfee",(allocator<char> *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"",(allocator<char> *)&stack0xfffffffffffffe07);
      strDefault = (char *)&local_78;
      ArgsManager::GetArg(&local_1d8.original,argsman,&local_58,(string *)strDefault);
      oVar5 = ParseMoney(&local_1d8.original);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"dustrelayfee",(allocator<char> *)&stack0xfffffffffffffe07);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"-dustrelayfee",(allocator<char> *)&stack0xfffffffffffffe06);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"",(allocator<char> *)&stack0xfffffffffffffe05);
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_d8);
        common::AmountErrMsg(&local_158,&local_1d8.original,&local_58);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_158);
        pbVar4 = &local_158;
        goto LAB_00236383;
      }
      (mempool_opts->dust_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"-permitbaremultisig",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&local_1d8.original,true);
    mempool_opts->permit_bare_multisig = bVar2;
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"-datacarrier",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&local_1d8.original,true);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-datacarriersize",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg(argsman,&local_1d8.original,0x53);
      if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = true;
      }
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value = (uint)iVar3;
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"-acceptnonstdtxn",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&local_1d8.original,false);
    mempool_opts->require_standard = !bVar2;
    std::__cxx11::string::~string((string *)&local_1d8);
    if ((chainparams->m_chain_type != MAIN) || (mempool_opts->require_standard != false)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-mempoolfullrbf",(allocator<char> *)&local_58);
      bVar2 = ArgsManager::GetBoolArg(argsman,&local_1d8.original,mempool_opts->full_rbf);
      mempool_opts->full_rbf = bVar2;
      std::__cxx11::string::~string((string *)&local_1d8);
      if (mempool_opts->full_rbf == false) {
        logging_function_00._M_str = "ApplyArgsManOptions";
        logging_function_00._M_len = 0x13;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_args.cpp"
        ;
        source_file_00._M_len = 0x65;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x61,ALL,Info,
                   (ConstevalFormatString<0U>)0x6a7057);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-persistmempoolv1",(allocator<char> *)&local_58);
      bVar2 = ArgsManager::GetBoolArg(argsman,&local_1d8.original,mempool_opts->persist_v1_dat);
      mempool_opts->persist_v1_dat = bVar2;
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-limitancestorcount",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg
                        (argsman,&local_1d8.original,(mempool_opts->limits).ancestor_count);
      (mempool_opts->limits).ancestor_count = iVar3;
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-limitancestorsize",(allocator<char> *)&local_58);
      oVar5 = ArgsManager::GetIntArg(argsman,&local_1d8.original);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).ancestor_size_vbytes =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-limitdescendantcount",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg
                        (argsman,&local_1d8.original,(mempool_opts->limits).descendant_count);
      (mempool_opts->limits).descendant_count = iVar3;
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"-limitdescendantsize",(allocator<char> *)&local_58);
      oVar5 = ArgsManager::GetIntArg(argsman,&local_1d8.original);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).descendant_size_vbytes =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
      goto LAB_002363b9;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe08,
               "acceptnonstdtxn is not currently supported for %s chain",
               (allocator<char> *)&local_78);
    Untranslated(&local_1d8,in_stack_fffffffffffffdf8);
    CChainParams::GetChainTypeString_abi_cxx11_(&local_58,chainparams);
    tinyformat::format<std::__cxx11::string>
              (&local_198,(tinyformat *)&local_1d8,(bilingual_str *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_198);
    bilingual_str::~bilingual_str(&local_198);
    std::__cxx11::string::~string((string *)&local_58);
    bilingual_str::~bilingual_str(&local_1d8);
    pbVar4 = (bilingual_str *)&stack0xfffffffffffffe08;
  }
  std::__cxx11::string::~string((string *)pbVar4);
LAB_002363b9:
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& argsman, const CChainParams& chainparams, MemPoolOptions& mempool_opts)
{
    mempool_opts.check_ratio = argsman.GetIntArg("-checkmempool", mempool_opts.check_ratio);

    if (auto mb = argsman.GetIntArg("-maxmempool")) mempool_opts.max_size_bytes = *mb * 1'000'000;

    if (auto hours = argsman.GetIntArg("-mempoolexpiry")) mempool_opts.expiry = std::chrono::hours{*hours};

    // incremental relay fee sets the minimum feerate increase necessary for replacement in the mempool
    // and the amount the mempool min fee increases above the feerate of txs evicted due to mempool limiting.
    if (argsman.IsArgSet("-incrementalrelayfee")) {
        if (std::optional<CAmount> inc_relay_fee = ParseMoney(argsman.GetArg("-incrementalrelayfee", ""))) {
            mempool_opts.incremental_relay_feerate = CFeeRate{inc_relay_fee.value()};
        } else {
            return util::Error{AmountErrMsg("incrementalrelayfee", argsman.GetArg("-incrementalrelayfee", ""))};
        }
    }

    if (argsman.IsArgSet("-minrelaytxfee")) {
        if (std::optional<CAmount> min_relay_feerate = ParseMoney(argsman.GetArg("-minrelaytxfee", ""))) {
            // High fee check is done afterward in CWallet::Create()
            mempool_opts.min_relay_feerate = CFeeRate{min_relay_feerate.value()};
        } else {
            return util::Error{AmountErrMsg("minrelaytxfee", argsman.GetArg("-minrelaytxfee", ""))};
        }
    } else if (mempool_opts.incremental_relay_feerate > mempool_opts.min_relay_feerate) {
        // Allow only setting incremental fee to control both
        mempool_opts.min_relay_feerate = mempool_opts.incremental_relay_feerate;
        LogPrintf("Increasing minrelaytxfee to %s to match incrementalrelayfee\n", mempool_opts.min_relay_feerate.ToString());
    }

    // Feerate used to define dust.  Shouldn't be changed lightly as old
    // implementations may inadvertently create non-standard transactions
    if (argsman.IsArgSet("-dustrelayfee")) {
        if (std::optional<CAmount> parsed = ParseMoney(argsman.GetArg("-dustrelayfee", ""))) {
            mempool_opts.dust_relay_feerate = CFeeRate{parsed.value()};
        } else {
            return util::Error{AmountErrMsg("dustrelayfee", argsman.GetArg("-dustrelayfee", ""))};
        }
    }

    mempool_opts.permit_bare_multisig = argsman.GetBoolArg("-permitbaremultisig", DEFAULT_PERMIT_BAREMULTISIG);

    if (argsman.GetBoolArg("-datacarrier", DEFAULT_ACCEPT_DATACARRIER)) {
        mempool_opts.max_datacarrier_bytes = argsman.GetIntArg("-datacarriersize", MAX_OP_RETURN_RELAY);
    } else {
        mempool_opts.max_datacarrier_bytes = std::nullopt;
    }

    mempool_opts.require_standard = !argsman.GetBoolArg("-acceptnonstdtxn", DEFAULT_ACCEPT_NON_STD_TXN);
    if (!chainparams.IsTestChain() && !mempool_opts.require_standard) {
        return util::Error{strprintf(Untranslated("acceptnonstdtxn is not currently supported for %s chain"), chainparams.GetChainTypeString())};
    }

    mempool_opts.full_rbf = argsman.GetBoolArg("-mempoolfullrbf", mempool_opts.full_rbf);
    if (!mempool_opts.full_rbf) {
        LogInfo("Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n");
    }

    mempool_opts.persist_v1_dat = argsman.GetBoolArg("-persistmempoolv1", mempool_opts.persist_v1_dat);

    ApplyArgsManOptions(argsman, mempool_opts.limits);

    return {};
}